

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O0

void __thiscall OpenMD::SimSnapshotManager::~SimSnapshotManager(SimSnapshotManager *this)

{
  undefined8 *in_RDI;
  Snapshot *in_stack_ffffffffffffffe0;
  Snapshot *this_00;
  SnapshotManager *this_01;
  
  *in_RDI = &PTR__SimSnapshotManager_004830c8;
  this_01 = (SnapshotManager *)in_RDI[4];
  if (this_01 != (SnapshotManager *)0x0) {
    Snapshot::~Snapshot(in_stack_ffffffffffffffe0);
    operator_delete(this_01,0xa98);
  }
  this_00 = (Snapshot *)in_RDI[3];
  if (this_00 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(this_00);
    operator_delete(this_00,0xa98);
  }
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  SnapshotManager::~SnapshotManager(this_01);
  return;
}

Assistant:

SimSnapshotManager::~SimSnapshotManager() {
    delete previousSnapshot_;
    delete currentSnapshot_;
    previousSnapshot_ = NULL;
    currentSnapshot_  = NULL;
  }